

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O3

void vdpu383_setup_statistic(Vdpu383CtrlReg *ctrl_regs)

{
  ulong uVar1;
  
  uVar1._0_4_ = ctrl_regs->reg28;
  uVar1._4_4_ = ctrl_regs->reg29;
  uVar1 = uVar1 & 0xfe00f000fffff006 | (ulong)DAT_002a2e20;
  ctrl_regs->reg28 = (SWREG28_DEBUG_PERF_LATENCY_CTRL0)(int)uVar1;
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)(int)(uVar1 >> 0x20);
  ctrl_regs->reg30 = (SWREG30_QOS_CTRL)((uint)ctrl_regs->reg30 & 0xf0fff0ff);
  return;
}

Assistant:

void vdpu383_setup_statistic(Vdpu383CtrlReg *ctrl_regs)
{
    ctrl_regs->reg28.axi_perf_work_e = 1;
    ctrl_regs->reg28.axi_cnt_type = 1;
    ctrl_regs->reg28.rd_latency_id = 11;

    ctrl_regs->reg29.addr_align_type     = 1;
    ctrl_regs->reg29.ar_cnt_id_type      = 0;
    ctrl_regs->reg29.aw_cnt_id_type      = 1;
    ctrl_regs->reg29.ar_count_id         = 17;
    ctrl_regs->reg29.aw_count_id         = 0;
    ctrl_regs->reg29.rd_band_width_mode  = 0;

    /* set hurry */
    ctrl_regs->reg30.axi_wr_qos = 0;
    ctrl_regs->reg30.axi_rd_qos = 0;
}